

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O2

void __thiscall
icu_63::ContractionsAndExpansions::forCodePoint
          (ContractionsAndExpansions *this,CollationData *d,UChar32 c,UErrorCode *ec)

{
  uint32_t ce32;
  
  if (U_ZERO_ERROR < *ec) {
    return;
  }
  this->errorCode = *ec;
  ce32 = CollationData::getCE32(d,c);
  if (ce32 == 0xc0) {
    d = d->base;
    ce32 = CollationData::getCE32(d,c);
  }
  this->data = d;
  handleCE32(this,c,c,ce32);
  *ec = this->errorCode;
  return;
}

Assistant:

void
ContractionsAndExpansions::forCodePoint(const CollationData *d, UChar32 c, UErrorCode &ec) {
    if(U_FAILURE(ec)) { return; }
    errorCode = ec;  // Preserve info & warning codes.
    uint32_t ce32 = d->getCE32(c);
    if(ce32 == Collation::FALLBACK_CE32) {
        d = d->base;
        ce32 = d->getCE32(c);
    }
    data = d;
    handleCE32(c, c, ce32);
    ec = errorCode;
}